

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O0

int GetInitialDevicesState(void)

{
  int iVar1;
  char *pcVar2;
  int local_c;
  
  iVar1 = GetDeviceCurrentState("CurArmadeusState.txt",&bArmadeusON);
  if (iVar1 == 0) {
    iVar1 = GetDeviceCurrentState("CurBottomPumpState.txt",&bBottomPumpON);
    if (iVar1 == 0) {
      iVar1 = GetDeviceCurrentState("CurSurfacePumpState.txt",&bSurfacePumpON);
      if (iVar1 == 0) {
        iVar1 = GetDeviceCurrentState("CurProbeState.txt",&bProbeON);
        if (iVar1 == 0) {
          iVar1 = GetDeviceCurrentState("CurWifiState.txt",&bWifiON);
          if (iVar1 == 0) {
            iVar1 = GetDeviceCurrentState("CurIridiumState.txt",&bIridiumON);
            if (iVar1 == 0) {
              iVar1 = GetDeviceCurrentState("CurSailMotorState.txt",&bSailMotorON);
              if (iVar1 == 0) {
                printf("Devices default state : \n");
                pcVar2 = "OFF";
                if (bArmadeusON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Armadeus : %s\n",pcVar2);
                pcVar2 = "OFF";
                if (bBottomPumpON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Bottom pump : %s\n",pcVar2);
                pcVar2 = "OFF";
                if (bSurfacePumpON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Surface pump : %s\n",pcVar2);
                pcVar2 = "OFF";
                if (bProbeON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Probe : %s\n",pcVar2);
                pcVar2 = "OFF";
                if (bWifiON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Wi-Fi : %s\n",pcVar2);
                pcVar2 = "OFF";
                if (bIridiumON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Iridium : %s\n",pcVar2);
                pcVar2 = "OFF";
                if (bSailMotorON != 0) {
                  pcVar2 = "ON";
                }
                printf("   Sail motor : %s\n",pcVar2);
                fflush(_stdout);
                local_c = 0;
              }
              else {
                local_c = 1;
              }
            }
            else {
              local_c = 1;
            }
          }
          else {
            local_c = 1;
          }
        }
        else {
          local_c = 1;
        }
      }
      else {
        local_c = 1;
      }
    }
    else {
      local_c = 1;
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int GetInitialDevicesState(void)
{
	if (GetDeviceCurrentState("CurArmadeusState.txt", &bArmadeusON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurBottomPumpState.txt", &bBottomPumpON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurSurfacePumpState.txt", &bSurfacePumpON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurProbeState.txt", &bProbeON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurWifiState.txt", &bWifiON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurIridiumState.txt", &bIridiumON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (GetDeviceCurrentState("CurSailMotorState.txt", &bSailMotorON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	printf("Devices default state : \n");
	printf("   Armadeus : %s\n", bArmadeusON? "ON": "OFF");
	printf("   Bottom pump : %s\n", bBottomPumpON? "ON": "OFF");
	printf("   Surface pump : %s\n", bSurfacePumpON? "ON": "OFF");
	printf("   Probe : %s\n", bProbeON? "ON": "OFF");
	printf("   Wi-Fi : %s\n", bWifiON? "ON": "OFF");
	printf("   Iridium : %s\n", bIridiumON? "ON": "OFF");
	printf("   Sail motor : %s\n", bSailMotorON? "ON": "OFF");
	fflush(stdout);

	return EXIT_SUCCESS;
}